

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjCollectInternalCut(Gia_Man_t *p,int iRoot,Vec_Int_t *vLeaves)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  int local_24;
  int iObj;
  int i;
  Vec_Int_t *vLeaves_local;
  int iRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjHasNumId(p,iRoot);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x14b,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
  }
  pObj = Gia_ManObj(p,iRoot);
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iRoot))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x14c,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
  }
  for (local_24 = 0; iVar1 = Vec_IntSize(vLeaves), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vLeaves,local_24);
    iVar2 = Gia_ObjHasNumId(p,iVar1);
    if (iVar2 != 0) {
      __assert_fail("!Gia_ObjHasNumId(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                    ,0x14f,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
    }
    Gia_ObjSetNumId(p,iVar1,-local_24);
  }
  iVar1 = Gia_ObjHasNumId(p,iRoot);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x152,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
  }
  Vec_IntClear(p->vTtNodes);
  Vec_IntPush(p->vTtNodes,-1);
  Gia_ObjCollectInternalCut_rec(p,iRoot);
  return;
}

Assistant:

void Gia_ObjCollectInternalCut( Gia_Man_t * p, int iRoot, Vec_Int_t * vLeaves )
{
    int i, iObj;
    assert( !Gia_ObjHasNumId(p, iRoot) );
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iRoot)) );
    Vec_IntForEachEntry( vLeaves, iObj, i )
    {
        assert( !Gia_ObjHasNumId(p, iObj) );
        Gia_ObjSetNumId( p, iObj, -i );
    }
    assert( !Gia_ObjHasNumId(p, iRoot) ); // the root cannot be one of the leaves
    Vec_IntClear( p->vTtNodes );
    Vec_IntPush( p->vTtNodes, -1 );
    Gia_ObjCollectInternalCut_rec( p, iRoot );
}